

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuildPartial
          (MessageBuilderGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  OneofDescriptor *oneof;
  bool bVar1;
  uint uVar2;
  int iVar3;
  Descriptor *pDVar4;
  Nonnull<char_*> pcVar5;
  ImmutableFieldGenerator *pIVar6;
  reference ppVar7;
  OneofGeneratorInfo *args_1;
  Descriptor *pDVar8;
  undefined8 extraout_RAX;
  uint uVar9;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  int piece;
  int iVar11;
  java *this_00;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_01;
  undefined4 uVar12;
  long lVar13;
  long lVar14;
  iterator iVar15;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  const_iterator other;
  string_view text_08;
  bool local_c4;
  string local_c0;
  MessageBuilderGenerator *local_90;
  btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  *local_88;
  undefined4 local_7c;
  ulong local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  undefined7 extraout_var;
  ulong uVar10;
  
  ClassNameResolver::GetClassName_abi_cxx11_(&local_c0,this->name_resolver_,this->descriptor_,true);
  text._M_str = 
  "@java.lang.Override\npublic $classname$ buildPartial() {\n  $classname$ result = new $classname$(this);\n"
  ;
  text._M_len = 0x66;
  io::Printer::Print<char[10],std::__cxx11::string>(printer,text,(char (*) [10])0x13005f3,&local_c0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  pDVar8 = this->descriptor_;
  iVar11 = pDVar8->field_count_;
  local_90 = this;
  if (iVar11 < 1) {
    iVar3 = iVar11 + 0x3e;
    if (-1 < iVar11 + 0x1f) {
      iVar3 = iVar11 + 0x1f;
    }
    local_78 = (ulong)(uint)(iVar3 >> 5);
    local_c4 = false;
    uVar12 = 0;
  }
  else {
    lVar13 = 0;
    lVar14 = 0;
    do {
      local_c4 = anon_unknown_16::BitfieldTracksMutability
                           ((FieldDescriptor *)(&pDVar8->fields_->super_SymbolBase + lVar13));
      pDVar4 = (Descriptor *)CONCAT71(extraout_var,local_c4);
      if (local_c4) {
        text_00._M_str = "buildPartialRepeatedFields(result);\n";
        text_00._M_len = 0x24;
        io::Printer::Print<>(printer,text_00);
        pDVar4 = this->descriptor_;
        iVar11 = pDVar4->field_count_;
        break;
      }
      lVar14 = lVar14 + 1;
      pDVar8 = this->descriptor_;
      iVar11 = pDVar8->field_count_;
      lVar13 = lVar13 + 0x58;
    } while (lVar14 < iVar11);
    iVar3 = iVar11 + 0x3e;
    if (-1 < iVar11 + 0x1f) {
      iVar3 = iVar11 + 0x1f;
    }
    uVar9 = iVar3 >> 5;
    uVar10 = (ulong)uVar9;
    this_00 = (java *)0x0;
    local_78 = uVar10;
    if (iVar11 < 1) {
      uVar12 = 0;
    }
    else {
      local_7c = (undefined4)CONCAT71((int7)((ulong)pDVar4 >> 8),0 < iVar11);
      uVar2 = 1;
      if (1 < (int)uVar9) {
        uVar2 = uVar9;
      }
      local_88 = (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
                  *)CONCAT44(local_88._4_4_,uVar2);
      do {
        GetBitFieldName_abi_cxx11_(&local_50,this_00,(int)uVar10);
        buffer = &local_c0.field_2;
        pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                           ((int)this_00,buffer->_M_local_buf);
        local_c0._M_dataplus._M_p = pcVar5 + -(long)buffer;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_c0._M_string_length = (size_type)buffer;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,buffer,pcVar5);
        text_01._M_str = "if ($bit_field_name$ != 0) { buildPartial$piece$(result); }\n";
        text_01._M_len = 0x3c;
        io::Printer::Print<char[15],std::__cxx11::string,char[6],std::__cxx11::string>
                  (printer,text_01,(char (*) [15])"bit_field_name",&local_50,(char (*) [6])0x125ae1a
                   ,&local_70);
        uVar10 = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          uVar10 = extraout_RDX_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          uVar10 = extraout_RDX_01;
        }
        uVar9 = (int)this_00 + 1;
        this_00 = (java *)(ulong)uVar9;
        this = local_90;
        uVar12 = local_7c;
      } while ((uint)local_88 != uVar9);
    }
  }
  if ((this->oneofs_).
      super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .tree_.size_ != 0) {
    text_02._M_str = "buildPartialOneofs(result);\n";
    text_02._M_len = 0x1c;
    io::Printer::Print<>(printer,text_02);
  }
  io::Printer::Outdent(printer);
  ClassNameResolver::GetClassName_abi_cxx11_(&local_c0,this->name_resolver_,this->descriptor_,true);
  text_03._M_str = "  onBuilt();\n  return result;\n}\n\n";
  text_03._M_len = 0x21;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_03,(char (*) [10])0x13005f3,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_c4 != false) {
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_c0,this->name_resolver_,this->descriptor_,true);
    text_04._M_str = "private void buildPartialRepeatedFields($classname$ result) {\n";
    text_04._M_len = 0x3e;
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,text_04,(char (*) [10])0x13005f3,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    pDVar8 = this->descriptor_;
    if (0 < pDVar8->field_count_) {
      lVar13 = 0;
      this_01 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)0x0;
      do {
        bVar1 = anon_unknown_16::BitfieldTracksMutability
                          ((FieldDescriptor *)(&pDVar8->fields_->super_SymbolBase + lVar13));
        if (bVar1) {
          if ((long)this->descriptor_->field_count_ <= (long)this_01) {
LAB_00e6d6aa:
            GenerateBuildPartial();
            if ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)
                local_c0._M_dataplus._M_p != this_01) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            _Unwind_Resume(extraout_RAX);
          }
          pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (&this->field_generators_,
                              (FieldDescriptor *)
                              (&this->descriptor_->fields_->super_SymbolBase + lVar13));
          (*(pIVar6->super_FieldGenerator)._vptr_FieldGenerator[0xd])(pIVar6,printer);
        }
        this_01 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)
                  ((long)&this_01->descriptor_ + 1);
        pDVar8 = this->descriptor_;
        lVar13 = lVar13 + 0x58;
      } while ((long)this_01 < (long)pDVar8->field_count_);
    }
    io::Printer::Outdent(printer);
    text_05._M_str = "}\n\n";
    text_05._M_len = 3;
    io::Printer::Print<>(printer,text_05);
  }
  if ((char)uVar12 != '\0') {
    iVar11 = 1;
    if (1 < (int)local_78) {
      iVar11 = (int)local_78;
    }
    iVar3 = 0;
    piece = 0;
    do {
      iVar3 = GenerateBuildPartialPiece(this,printer,piece,iVar3);
      piece = piece + 1;
    } while (iVar11 != piece);
  }
  if ((this->oneofs_).
      super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .tree_.size_ != 0) {
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_c0,this->name_resolver_,this->descriptor_,true);
    text_06._M_str = "private void buildPartialOneofs($classname$ result) {\n";
    text_06._M_len = 0x36;
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,text_06,(char (*) [10])0x13005f3,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    iVar15 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                      *)&this->oneofs_);
    local_50._M_dataplus._M_p = (pointer)iVar15.node_;
    local_50._M_string_length._0_4_ = iVar15.position_;
    iVar15 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)&this->oneofs_);
    local_88 = iVar15.node_;
    other.position_ = iVar15.position_;
    bVar1 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
            ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                      *)&local_50,(const_iterator)iVar15);
    if (!bVar1) {
      this_01 = &local_90->field_generators_;
      do {
        ppVar7 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                 ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                              *)&local_50);
        oneof = ppVar7->second;
        args_1 = Context::GetOneofGeneratorInfo(local_90->context_,oneof);
        text_07._M_str =
             "result.$oneof_name$Case_ = $oneof_name$Case_;\nresult.$oneof_name$_ = this.$oneof_name$_;\n"
        ;
        text_07._M_len = 0x59;
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,text_07,(char (*) [11])0x12e0c8e,&args_1->name);
        if (0 < oneof->field_count_) {
          lVar14 = 0;
          lVar13 = 0;
          do {
            pDVar8 = FieldDescriptor::message_type
                               ((FieldDescriptor *)(&oneof->fields_->super_SymbolBase + lVar14));
            if (pDVar8 != (Descriptor *)0x0) {
              if (oneof->field_count_ <= lVar13) {
                GenerateBuildPartial();
                goto LAB_00e6d6aa;
              }
              pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
                       ::get(this_01,(FieldDescriptor *)(&oneof->fields_->super_SymbolBase + lVar14)
                            );
              (*(pIVar6->super_FieldGenerator)._vptr_FieldGenerator[0xd])(pIVar6,printer);
            }
            lVar13 = lVar13 + 1;
            lVar14 = lVar14 + 0x58;
          } while (lVar13 < oneof->field_count_);
        }
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
        ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                     *)&local_50);
        other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                       *)local_88;
        other._12_4_ = 0;
        bVar1 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                          *)&local_50,other);
      } while (!bVar1);
    }
    io::Printer::Outdent(printer);
    text_08._M_str = "}\n\n";
    text_08._M_len = 3;
    io::Printer::Print<>(printer,text_08);
  }
  return;
}

Assistant:

void MessageBuilderGenerator::GenerateBuildPartial(io::Printer* printer) {
  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ buildPartial() {\n"
      "  $classname$ result = new $classname$(this);\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();

  // Handle the repeated fields first so that the "mutable bits" are cleared.
  bool has_repeated_fields = false;
  for (int i = 0; i < descriptor_->field_count(); ++i) {
    if (BitfieldTracksMutability(descriptor_->field(i))) {
      has_repeated_fields = true;
      printer->Print("buildPartialRepeatedFields(result);\n");
      break;
    }
  }

  // One buildPartial#() per from_bit_field
  int totalBuilderInts = (descriptor_->field_count() + 31) / 32;
  if (totalBuilderInts > 0) {
    for (int i = 0; i < totalBuilderInts; ++i) {
      printer->Print(
          "if ($bit_field_name$ != 0) { buildPartial$piece$(result); }\n",
          "bit_field_name", GetBitFieldName(i), "piece", absl::StrCat(i));
    }
  }

  if (!oneofs_.empty()) {
    printer->Print("buildPartialOneofs(result);\n");
  }

  printer->Outdent();
  printer->Print(
      "  onBuilt();\n"
      "  return result;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Build Repeated Fields
  if (has_repeated_fields) {
    printer->Print(
        "private void buildPartialRepeatedFields($classname$ result) {\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); ++i) {
      if (BitfieldTracksMutability(descriptor_->field(i))) {
        const ImmutableFieldGenerator& field =
            field_generators_.get(descriptor_->field(i));
        field.GenerateBuildingCode(printer);
      }
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }

  // Build non-oneof fields
  int start_field = 0;
  for (int i = 0; i < totalBuilderInts; i++) {
    start_field = GenerateBuildPartialPiece(printer, i, start_field);
  }

  // Build Oneofs
  if (!oneofs_.empty()) {
    printer->Print("private void buildPartialOneofs($classname$ result) {\n",
                   "classname",
                   name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();
    for (auto& kv : oneofs_) {
      const OneofDescriptor* oneof = kv.second;
      printer->Print(
          "result.$oneof_name$Case_ = $oneof_name$Case_;\n"
          "result.$oneof_name$_ = this.$oneof_name$_;\n",
          "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name);
      for (int i = 0; i < oneof->field_count(); ++i) {
        if (oneof->field(i)->message_type() != nullptr) {
          const ImmutableFieldGenerator& field =
              field_generators_.get(oneof->field(i));
          field.GenerateBuildingCode(printer);
        }
      }
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }
}